

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O0

void __thiscall Itemset::print_seq(Itemset *this,ostream *seqstrm,int itempl)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  ostream *poVar4;
  reference pvVar5;
  uint local_20;
  int sz;
  int i;
  int itempl_local;
  ostream *seqstrm_local;
  Itemset *this_local;
  
  iVar1 = size(this);
  peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  iVar2 = Array::operator[](peVar3,0);
  poVar4 = (ostream *)std::ostream::operator<<(seqstrm,iVar2);
  std::operator<<(poVar4," ");
  for (local_20 = 1; (int)local_20 < iVar1 + -1; local_20 = local_20 + 1) {
    if ((itempl & 1 << (((char)iVar1 + -1) - (char)local_20 & 0x1fU)) != 0) {
      std::operator<<(seqstrm,"-> ");
    }
    peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                       );
    iVar2 = Array::operator[](peVar3,local_20);
    poVar4 = (ostream *)std::ostream::operator<<(seqstrm,iVar2);
    std::operator<<(poVar4," ");
  }
  if ((itempl & 1 << (((char)iVar1 + -1) - (char)local_20 & 0x1fU)) != 0) {
    std::operator<<(seqstrm,"-> ");
  }
  peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  iVar1 = Array::operator[](peVar3,iVar1 - 1);
  poVar4 = (ostream *)std::ostream::operator<<(seqstrm,iVar1);
  std::operator<<(poVar4," ");
  poVar4 = std::operator<<(seqstrm,"-- ");
  std::ostream::operator<<(poVar4,this->theSupport);
  for (local_20 = 0; (int)local_20 < this->num_class; local_20 = local_20 + 1) {
    poVar4 = std::operator<<(seqstrm," ");
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->clsSup,(long)(int)local_20);
    std::ostream::operator<<(poVar4,*pvVar5);
  }
  std::operator<<(seqstrm," ");
  std::ostream::operator<<(seqstrm,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Itemset::print_seq(ostream& seqstrm, int itempl) {
    int i;
    int sz = size();
    seqstrm << (*theItemset)[0] << " ";
    for (i = 1; i < sz - 1; i++) {
        if (GETBIT(itempl, sz - 1 - i))
            seqstrm << "-> ";
        seqstrm << (*theItemset)[i] << " ";
    }
    if (GETBIT(itempl, sz - 1 - i))
        seqstrm << "-> ";
    seqstrm << (*theItemset)[sz - 1] << " ";
    seqstrm << "-- " << theSupport;
    for (i = 0; i < num_class; i++)
        seqstrm << " " << clsSup[i];
    seqstrm << " ";
//    if (do_print) print_idlist();
    seqstrm << endl;
}